

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::Exception::SetWhat<char_const*&,char_const(&)[7]>
          (Exception *this,ostringstream *oss,char **arg,char (*args) [7])

{
  std::operator<<((ostream *)oss,*arg);
  std::operator<<((ostream *)oss,*args);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }